

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

int32_t __thiscall xla::GraphCycles::NewNode(GraphCycles *this)

{
  pointer *ppNVar1;
  pointer *ppNVar2;
  Rep *pRVar3;
  pointer piVar4;
  pointer this_00;
  pointer __first;
  ulong uVar5;
  pointer pNVar6;
  ulong uVar7;
  pointer __result;
  pointer pNVar8;
  pointer pNVar9;
  long lVar10;
  size_t __n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ulong uVar11;
  NodeIO *__p;
  size_t __n_00;
  ulong uVar12;
  void *local_38;
  
  pRVar3 = this->rep_;
  piVar4 = (pRVar3->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pRVar3->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar4) {
    this_00 = (pRVar3->nodes_).
              super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pNVar6 = (pRVar3->nodes_).
             super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n_00 = (long)pNVar6 - (long)this_00;
    uVar11 = (long)__n_00 >> 3;
    __n = 0x7fffffffffffff80;
    if (pNVar6 == (pRVar3->nodes_).
                  super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if (__n_00 == 0x7ffffffffffffff8) goto LAB_00182542;
      uVar5 = uVar11;
      if (pNVar6 == this_00) {
        uVar5 = 1;
      }
      uVar7 = uVar5 + uVar11;
      if (0xffffffffffffffe < uVar7) {
        uVar7 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar5,uVar11)) {
        uVar7 = 0xfffffffffffffff;
      }
      if (uVar7 == 0) {
        pNVar6 = (pointer)0x0;
      }
      else {
        pNVar6 = (pointer)operator_new(uVar7 * 8);
        __n = extraout_RDX;
      }
      pNVar6[uVar11] = (Node)(uVar11 & 0xffffffff);
      if (0 < (long)__n_00) {
        memmove(pNVar6,this_00,__n_00);
        __n = extraout_RDX_00;
      }
      std::
      _Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ::_M_deallocate((_Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                       *)this_00,
                      (pointer)((long)(pRVar3->nodes_).
                                      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)this_00 >> 3),__n);
      (pRVar3->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_start = pNVar6;
      (pRVar3->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pNVar6 + __n_00 + 8);
      (pRVar3->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pNVar6 + uVar7;
    }
    else {
      *pNVar6 = (Node)(uVar11 & 0xffffffff);
      ppNVar1 = &(pRVar3->nodes_).
                 super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    pRVar3 = this->rep_;
    pNVar9 = (pRVar3->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar9 == (pRVar3->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __first = (pRVar3->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pNVar9 - (long)__first == 0x7fffffffffffff80) {
LAB_00182542:
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = ((long)pNVar9 - (long)__first) / 0xa0;
      uVar5 = 1;
      if (pNVar9 != __first) {
        uVar5 = uVar7;
      }
      uVar12 = uVar5 + uVar7;
      if (0xcccccccccccccb < uVar12) {
        uVar12 = 0xcccccccccccccc;
      }
      __p = (NodeIO *)(uVar5 + uVar7);
      if (CARRY8(uVar5,uVar7)) {
        uVar12 = 0xcccccccccccccc;
      }
      pNVar8 = __first;
      if (uVar12 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar12 * 0xa0);
      }
      std::allocator_traits<std::allocator<xla::(anonymous_namespace)::NodeIO>_>::
      construct<xla::(anonymous_namespace)::NodeIO>((allocator_type *)(__result + uVar7),__p);
      pNVar8 = std::
               vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ::_S_relocate(__first,pNVar9,__result,(_Tp_alloc_type *)pNVar8);
      pNVar9 = std::
               vector<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ::_S_relocate(pNVar9,pNVar9,pNVar8 + 1,(_Tp_alloc_type *)0xa0);
      lVar10 = (long)(pRVar3->node_io_).
                     super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
      std::
      _Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ::_M_deallocate((_Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                       *)__first,(pointer)(lVar10 / 0xa0),lVar10 % 0xa0);
      (pRVar3->node_io_).
      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (pRVar3->node_io_).
      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ._M_impl.super__Vector_impl_data._M_finish = pNVar9;
      (pRVar3->node_io_).
      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar12;
    }
    else {
      std::allocator_traits<std::allocator<xla::(anonymous_namespace)::NodeIO>_>::
      construct<xla::(anonymous_namespace)::NodeIO>((allocator_type *)pNVar9,(NodeIO *)0x1);
      ppNVar2 = &(pRVar3->node_io_).
                 super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar2 = *ppNVar2 + 1;
    }
    local_38 = (void *)0x0;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&this->rep_->node_data_,&local_38);
  }
  else {
    uVar11 = (ulong)piVar4[-1];
    (pRVar3->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar4 + -1;
    (pRVar3->node_data_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar11] = (void *)0x0;
  }
  return (int32_t)uVar11;
}

Assistant:

int32_t GraphCycles::NewNode() {
  if (rep_->free_nodes_.empty()) {
    Node n;
    n.visited = false;
    n.rank = static_cast<int32_t>(rep_->nodes_.size());
    rep_->nodes_.emplace_back(n);
    rep_->node_io_.emplace_back();
    rep_->node_data_.push_back(nullptr);
    return n.rank;
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    rep_->node_data_[r] = nullptr;
    return r;
  }
}